

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O3

void __thiscall miniros::NodeHandle::NodeHandle(NodeHandle *this,string *ns,M_string *remappings)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  string *psVar4;
  string tilde_resolved_ns;
  string local_70;
  string local_50;
  
  psVar4 = this_node::getNamespace_abi_cxx11_();
  (this->namespace_)._M_dataplus._M_p = (pointer)&(this->namespace_).field_2;
  pcVar3 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + psVar4->_M_string_length)
  ;
  (this->unresolved_namespace_)._M_dataplus._M_p = (pointer)&(this->unresolved_namespace_).field_2;
  (this->unresolved_namespace_)._M_string_length = 0;
  (this->unresolved_namespace_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->remappings_)._M_t._M_impl.super__Rb_tree_header;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->remappings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->callback_queue_ = (CallbackQueueInterface *)0x0;
  this->collection_ = (NodeHandleBackingCollection *)0x0;
  paVar2 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar2;
  if ((ns->_M_string_length == 0) || (*(ns->_M_dataplus)._M_p != '~')) {
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  else {
    names::resolve(&local_50,ns,true);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  construct(this,&local_70,true);
  initRemappings(this,remappings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

NodeHandle::NodeHandle(const std::string& ns, const M_string& remappings)
  : namespace_(this_node::getNamespace())
  , callback_queue_(0)
  , collection_(0)
{
  std::string tilde_resolved_ns;
  if (!ns.empty() && ns[0] == '~')// starts with tilde
    tilde_resolved_ns = names::resolve(ns);
  else
    tilde_resolved_ns = ns;

  construct(tilde_resolved_ns, true);

  initRemappings(remappings);
}